

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

void visuals_cycler_free(visuals_cycler *cycler)

{
  ulong local_18;
  size_t i;
  visuals_cycler *cycler_local;
  
  if (cycler != (visuals_cycler *)0x0) {
    if (cycler->groups != (visuals_cycle_group **)0x0) {
      for (local_18 = 0; local_18 < cycler->max_groups; local_18 = local_18 + 1) {
        visuals_cycle_group_free(cycler->groups[local_18]);
      }
      mem_free(cycler->groups);
      cycler->groups = (visuals_cycle_group **)0x0;
    }
    mem_free(cycler);
  }
  return;
}

Assistant:

static void visuals_cycler_free(struct visuals_cycler *cycler)
{
	size_t i = 0;

	if (cycler == NULL) {
		return;
	}

	if (cycler->groups != NULL) {
		for (i = 0; i < cycler->max_groups; i++) {
			visuals_cycle_group_free(cycler->groups[i]);
		}

		mem_free(cycler->groups);
		cycler->groups = NULL;
	}

	mem_free(cycler);
	cycler = NULL;
}